

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::App::get_usage_abi_cxx11_(App *this)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  string *__lhs;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  bVar1 = ::std::function::operator_cast_to_bool
                    ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                      *)0x189687);
  if (bVar1) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)__lhs);
    ::std::operator+(__lhs,(char)((ulong)in_RDI >> 0x38));
    ::std::operator+(__lhs,in_RDI);
    ::std::__cxx11::string::~string(local_30);
    ::std::__cxx11::string::~string(local_50);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xf0));
  }
  return __lhs;
}

Assistant:

CLI11_NODISCARD std::string get_usage() const {
        return (usage_callback_) ? usage_callback_() + '\n' + usage_ : usage_;
    }